

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O1

png_uint_32
png_get_cHRM(png_const_structrp png_ptr,png_const_inforp info_ptr,double *white_x,double *white_y,
            double *red_x,double *red_y,double *green_x,double *green_y,double *blue_x,
            double *blue_y)

{
  png_uint_32 pVar1;
  
  pVar1 = 0;
  if ((info_ptr != (png_const_inforp)0x0 && png_ptr != (png_const_structrp)0x0) &&
     (((info_ptr->colorspace).flags & 2) != 0)) {
    if (white_x != (double *)0x0) {
      *white_x = (double)(info_ptr->colorspace).end_points_xy.whitex * 1e-05;
    }
    if (white_y != (double *)0x0) {
      *white_y = (double)(info_ptr->colorspace).end_points_xy.whitey * 1e-05;
    }
    if (red_x != (double *)0x0) {
      *red_x = (double)(info_ptr->colorspace).end_points_xy.redx * 1e-05;
    }
    if (red_y != (double *)0x0) {
      *red_y = (double)(info_ptr->colorspace).end_points_xy.redy * 1e-05;
    }
    if (green_x != (double *)0x0) {
      *green_x = (double)(info_ptr->colorspace).end_points_xy.greenx * 1e-05;
    }
    if (green_y != (double *)0x0) {
      *green_y = (double)(info_ptr->colorspace).end_points_xy.greeny * 1e-05;
    }
    if (blue_x != (double *)0x0) {
      *blue_x = (double)(info_ptr->colorspace).end_points_xy.bluex * 1e-05;
    }
    pVar1 = 4;
    if (blue_y != (double *)0x0) {
      *blue_y = (double)(info_ptr->colorspace).end_points_xy.bluey * 1e-05;
    }
  }
  return pVar1;
}

Assistant:

png_uint_32 PNGAPI
png_get_cHRM(png_const_structrp png_ptr, png_const_inforp info_ptr,
    double *white_x, double *white_y, double *red_x, double *red_y,
    double *green_x, double *green_y, double *blue_x, double *blue_y)
{
   /* Quiet API change: this code used to only return the end points if a cHRM
    * chunk was present, but the end points can also come from iCCP or sRGB
    * chunks, so in 1.6.0 the png_get_ APIs return the end points regardless and
    * the png_set_ APIs merely check that set end points are mutually
    * consistent.
    */
   if (png_ptr != NULL && info_ptr != NULL &&
      (info_ptr->colorspace.flags & PNG_COLORSPACE_HAVE_ENDPOINTS) != 0)
   {
      png_debug1(1, "in %s retrieval function", "cHRM");

      if (white_x != NULL)
         *white_x = png_float(png_ptr,
             info_ptr->colorspace.end_points_xy.whitex, "cHRM white X");
      if (white_y != NULL)
         *white_y = png_float(png_ptr,
             info_ptr->colorspace.end_points_xy.whitey, "cHRM white Y");
      if (red_x != NULL)
         *red_x = png_float(png_ptr, info_ptr->colorspace.end_points_xy.redx,
             "cHRM red X");
      if (red_y != NULL)
         *red_y = png_float(png_ptr, info_ptr->colorspace.end_points_xy.redy,
             "cHRM red Y");
      if (green_x != NULL)
         *green_x = png_float(png_ptr,
             info_ptr->colorspace.end_points_xy.greenx, "cHRM green X");
      if (green_y != NULL)
         *green_y = png_float(png_ptr,
             info_ptr->colorspace.end_points_xy.greeny, "cHRM green Y");
      if (blue_x != NULL)
         *blue_x = png_float(png_ptr, info_ptr->colorspace.end_points_xy.bluex,
             "cHRM blue X");
      if (blue_y != NULL)
         *blue_y = png_float(png_ptr, info_ptr->colorspace.end_points_xy.bluey,
             "cHRM blue Y");
      return (PNG_INFO_cHRM);
   }

   return (0);
}